

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CollectFieldsTest_SingleChunk_Test::TestBody
          (CollectFieldsTest_SingleChunk_Test *this)

{
  pointer *pppFVar1;
  iterator __position;
  size_type in_RCX;
  char *message;
  pointer ppFVar2;
  Span<const_char_*> field_names_00;
  FieldDescriptor *field;
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  chunks;
  AssertionResult gtest_ar;
  char *field_names [3];
  bool local_163;
  bool local_162;
  bool local_161;
  AssertHelper local_160;
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  local_158;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_140;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_120;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  bool local_98;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  undefined5 local_70;
  undefined3 uStack_6b;
  undefined5 uStack_68;
  bool local_63;
  undefined7 local_62;
  undefined4 uStack_5b;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  local_38 = "optional_int64";
  local_48 = "repeated_int32";
  pcStack_40 = "optional_int32";
  field_names_00.len_ = in_RCX;
  field_names_00.ptr_ = (pointer)0x3;
  CreateFieldArray<proto2_unittest::TestAllTypes>
            (&local_140,(anon_unknown_0 *)&local_48,field_names_00);
  local_118._M_p = (pointer)&local_108;
  local_128 = (undefined1  [8])0x0;
  pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_110 = 0;
  local_108._M_local_buf[0] = '\0';
  local_f8._M_p = (pointer)&local_e8;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = false;
  local_90.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_90.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_90.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  local_70 = 0;
  uStack_6b = 0;
  uStack_68._0_4_ = kNoEnforcement;
  uStack_68._4_1_ = false;
  local_63 = true;
  local_62._0_1_ = false;
  local_62._1_1_ = false;
  local_62._2_1_ = false;
  local_62._3_1_ = false;
  local_62._4_1_ = false;
  local_62._5_1_ = false;
  local_62._6_1_ = false;
  uStack_5b._0_1_ = false;
  uStack_5b._1_1_ = false;
  uStack_5b._2_1_ = false;
  uStack_5b._3_1_ = false;
  local_158.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_p = (pointer)&local_a8;
  if (local_140.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_140.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppFVar2 = local_140.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_160.data_ = (AssertHelperData *)*ppFVar2;
      if (local_158.
          super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_158.
          super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_161 = protobuf::internal::cpp::HasHasbit((FieldDescriptor *)local_160.data_);
        local_162 = IsRarelyPresent((FieldDescriptor *)local_160.data_,(Options *)local_128);
        local_163 = ShouldSplit((FieldDescriptor *)local_160.data_,(Options *)local_128);
        std::
        vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
        ::emplace_back<bool,bool,bool>
                  ((vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
                    *)&local_158,&local_161,&local_162,&local_163);
      }
      __position._M_current =
           local_158.
           super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          local_158.
          super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&local_158.
                       super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].fields,__position,
                   (FieldDescriptor **)&local_160);
      }
      else {
        *__position._M_current = (FieldDescriptor *)local_160.data_;
        pppFVar1 = &local_158.
                    super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      ppFVar2 = ppFVar2 + 1;
    } while (ppFVar2 !=
             local_140.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,
                    CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,
                    CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,
                    CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1);
  }
  if (local_140.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_140.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)local_158.
                       super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_158.
                       super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_160.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_128,"chunks.size()","1",(unsigned_long *)&local_140,(int *)&local_160
            );
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_140);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_chunk_test.cc"
               ,0x34,message);
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    if (local_140.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((*local_140.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->all_names_).payload_)();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  std::
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ::~vector(&local_158);
  return;
}

Assistant:

TEST(CollectFieldsTest, SingleChunk) {
  const char* field_names[] = {"repeated_int32", "optional_int32",
                               "optional_int64"};

  auto chunks = CreateAndCollectFields<TestAllTypes>(
      field_names, [](const FieldDescriptor* lhs, const FieldDescriptor* rhs) {
        return true;
      });

  EXPECT_EQ(chunks.size(), 1);
}